

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

char * ucnv_getAvailableName_63(int32_t n)

{
  char *pcVar1;
  UErrorCode err;
  UErrorCode local_c;
  
  if ((uint)n < 0x10000) {
    local_c = U_ZERO_ERROR;
    pcVar1 = ucnv_bld_getAvailableConverter_63((uint16_t)n,&local_c);
    if (local_c < U_ILLEGAL_ARGUMENT_ERROR) {
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

U_CAPI const char*   U_EXPORT2
ucnv_getAvailableName (int32_t n)
{
    if (0 <= n && n <= 0xffff) {
        UErrorCode err = U_ZERO_ERROR;
        const char *name = ucnv_bld_getAvailableConverter((uint16_t)n, &err);
        if (U_SUCCESS(err)) {
            return name;
        }
    }
    return NULL;
}